

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  stbi_uc asVar21 [4];
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  void *pvVar29;
  stbi__jpeg *psVar30;
  stbi_uc *psVar31;
  long lVar32;
  uchar *puVar33;
  code *pcVar34;
  undefined8 uVar35;
  long lVar36;
  ulong uVar37;
  short sVar38;
  int iVar39;
  ulong uVar40;
  int id;
  stbi__context *psVar41;
  int iVar42;
  undefined1 *puVar43;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar44;
  byte *pbVar45;
  stbi__result_info *ri_00;
  float *pfVar46;
  uint uVar47;
  ulong uVar48;
  stbi__uint16 *psVar49;
  void *pvVar50;
  stbi__uint16 *psVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  int iVar55;
  uint uVar56;
  stbi_uc *psVar57;
  short *psVar58;
  stbi_uc *psVar59;
  long in_FS_OFFSET;
  bool bVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  float *local_8988;
  stbi__context *local_8980;
  uint local_8978;
  float *local_8970;
  uint local_8968;
  uint local_8960;
  ulong local_8940;
  uint local_890c;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  int local_88d8;
  uint local_88c4;
  stbi_uc pal [256] [4];
  
  psVar59 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      pal._0_8_ = s;
      iVar16 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
      uVar35 = pal._0_8_;
      if (iVar16 == 0) {
        local_8980 = (stbi__context *)0x0;
      }
      else {
        if ((int)pal[8] < 9) {
          iVar16 = 8;
        }
        else {
          if (pal[8] != (stbi_uc  [4])0x10) {
            pcVar28 = "bad bits_per_channel";
            goto LAB_0010c61d;
          }
          iVar16 = 0x10;
        }
        ri->bits_per_channel = iVar16;
        local_8980 = (stbi__context *)pal._24_8_;
        if ((req_comp != 0) && (iVar16 = *(int *)(pal._0_8_ + 0xc), iVar16 != req_comp)) {
          if ((int)pal[8] < 9) {
            local_8980 = (stbi__context *)
                         stbi__convert_format
                                   ((uchar *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          else {
            local_8980 = (stbi__context *)
                         stbi__convert_format16
                                   ((stbi__uint16 *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                    *(uint *)(pal._0_8_ + 4));
          }
          *(int *)(uVar35 + 0xc) = req_comp;
          if (local_8980 == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar35;
        *y = *(int *)(uVar35 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar35 + 8);
        }
        pal._24_8_ = (void *)0x0;
      }
      free((void *)pal._24_8_);
      free((void *)pal._16_8_);
      psVar30 = (stbi__jpeg *)pal._8_8_;
      goto LAB_0010ca0c;
    }
    pcVar28 = "bad req_comp";
    goto LAB_0010c61d;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar17 = stbi__get32le(s);
    if (((0x38 < sVar17) || ((0x100010000001000U >> ((ulong)sVar17 & 0x3f) & 1) == 0)) &&
       ((sVar17 != 0x7c && (sVar17 != 0x6c)))) goto LAB_0010c7ae;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar29 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar29 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar18 = s->img_y;
    uVar27 = -uVar18;
    if (0 < (int)uVar18) {
      uVar27 = uVar18;
    }
    s->img_y = uVar27;
    if ((0x1000000 < uVar27) || (uVar24 = s->img_x, 0x1000000 < uVar24)) goto LAB_0010ed7e;
    local_8968 = 0xff;
    if (iStack_88f0 == 0xc) {
      if (0x17 < (int)value) goto LAB_0010d237;
      uVar25 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_0010d216:
      if (uVar25 == 0) goto LAB_0010d237;
      bVar8 = false;
LAB_0010d2aa:
      bVar60 = uStack_88e0 == 0xff000000;
      iVar16 = 4 - (uint)(uStack_88e0 == 0);
      asVar21 = value;
    }
    else {
      if ((int)value < 0x10) {
        uVar25 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
        goto LAB_0010d216;
      }
LAB_0010d237:
      if (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
          (stbi_uc *)(long)iStack_88f4) {
        pcVar28 = "bad offset";
        goto LAB_0010c61d;
      }
      uVar25 = 0;
      bVar8 = true;
      bVar60 = true;
      if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_0010d2aa;
      iVar16 = 3;
      asVar21[0] = '\x18';
      asVar21[1] = '\0';
      asVar21[2] = '\0';
      asVar21[3] = '\0';
      bVar8 = true;
    }
    s->img_n = iVar16;
    if (2 < req_comp) {
      iVar16 = req_comp;
    }
    iVar22 = stbi__mad3sizes_valid(iVar16,uVar24,uVar27,0);
    if (iVar22 == 0) goto LAB_0010ed7e;
    puVar33 = (uchar *)stbi__malloc_mad3(iVar16,uVar24,uVar27,0);
    if (puVar33 != (uchar *)0x0) {
      if ((int)asVar21 < 0x10) {
        if (!bVar8 && (int)uVar25 < 0x101) {
          uVar53 = 0;
          uVar48 = 0;
          if (0 < (int)uVar25) {
            uVar48 = (ulong)uVar25;
          }
          for (; uVar48 != uVar53; uVar53 = uVar53 + 1) {
            sVar9 = stbi__get8(s);
            pal[uVar53][2] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar53][1] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar53][0] = sVar9;
            if (iStack_88f0 != 0xc) {
              stbi__get8(s);
            }
            pal[uVar53][3] = 0xff;
          }
          stbi__skip(s,(uVar25 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                       (iStack_88f0 + local_88d8));
          if (asVar21 == (stbi_uc  [4])0x1) {
            local_8960 = -(s->img_x + 7 >> 3) & 3;
            iVar22 = 0;
            uVar27 = 0;
LAB_0010e6db:
            uVar48 = (ulong)uVar27;
            sVar17 = s->img_y;
            if (iVar22 < (int)sVar17) {
              iVar55 = 0;
              do {
                bVar12 = stbi__get8(s);
                sVar17 = s->img_x;
                iVar39 = 8;
                do {
                  uVar27 = (uint)uVar48;
                  if ((int)sVar17 <= iVar55) {
LAB_0010e780:
                    stbi__skip(s,local_8960);
                    iVar22 = iVar22 + 1;
                    goto LAB_0010e6db;
                  }
                  bVar60 = (bVar12 >> (iVar39 - 1U & 0x1f) & 1) != 0;
                  lVar36 = (long)(int)uVar27;
                  uVar48 = lVar36 + 3;
                  puVar33[lVar36] = pal[bVar60][0];
                  puVar33[lVar36 + 1] = pal[bVar60][1];
                  puVar33[lVar36 + 2] = pal[bVar60][2];
                  if (iVar16 == 4) {
                    puVar33[lVar36 + 3] = 0xff;
                    uVar48 = (ulong)(uVar27 + 4);
                  }
                  if (sVar17 - 1 == iVar55) {
                    uVar27 = (uint)uVar48;
                    goto LAB_0010e780;
                  }
                  iVar55 = iVar55 + 1;
                  iVar42 = iVar39 + -1;
                  bVar60 = 0 < iVar39;
                  iVar39 = iVar42;
                } while (iVar42 != 0 && bVar60);
              } while( true );
            }
          }
          else {
            if (asVar21 == (stbi_uc  [4])0x8) {
              sVar17 = s->img_x;
            }
            else {
              if (asVar21 != (stbi_uc  [4])0x4) {
                free(puVar33);
                pcVar28 = "bad bpp";
                goto LAB_0010c61d;
              }
              sVar17 = s->img_x + 1 >> 1;
            }
            uVar48 = 0;
            local_8978 = -sVar17 & 3;
            for (iVar22 = 0; sVar17 = s->img_y, iVar22 < (int)sVar17; iVar22 = iVar22 + 1) {
              for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 2) {
                bVar12 = stbi__get8(s);
                uVar27 = (uint)(bVar12 >> 4);
                if (asVar21 != (stbi_uc  [4])0x4) {
                  uVar27 = (uint)bVar12;
                }
                uVar24 = bVar12 & 0xf;
                if (asVar21 != (stbi_uc  [4])0x4) {
                  uVar24 = 0;
                }
                lVar36 = (long)(int)uVar48;
                uVar53 = lVar36 + 3;
                puVar33[lVar36] = pal[uVar27][0];
                puVar33[lVar36 + 1] = pal[uVar27][1];
                puVar33[lVar36 + 2] = pal[uVar27][2];
                if (iVar16 == 4) {
                  puVar33[lVar36 + 3] = 0xff;
                  uVar53 = (ulong)((int)uVar48 + 4);
                }
                if (iVar55 + 1U == s->img_x) {
                  uVar48 = uVar53 & 0xffffffff;
                  break;
                }
                if (asVar21 == (stbi_uc  [4])0x8) {
                  bVar12 = stbi__get8(s);
                  uVar24 = (uint)bVar12;
                }
                lVar36 = (long)(int)uVar53;
                uVar48 = lVar36 + 3;
                puVar33[lVar36] = pal[uVar24][0];
                puVar33[lVar36 + 1] = pal[uVar24][1];
                puVar33[lVar36 + 2] = pal[uVar24][2];
                if (iVar16 == 4) {
                  puVar33[lVar36 + 3] = 0xff;
                  uVar48 = (ulong)((int)uVar53 + 4);
                }
              }
              stbi__skip(s,local_8978);
            }
          }
          goto LAB_0010e7a2;
        }
        free(puVar33);
        pcVar28 = "invalid";
        goto LAB_0010c61d;
      }
      stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
      if (asVar21 != (stbi_uc  [4])0x10) {
        if (asVar21 == (stbi_uc  [4])0x20) {
          local_88fc = 0;
          if ((bool)((uStack_88ec == 0xff0000 && (local_88e8 == 0xff00 && uStack_88e4 == 0xff)) &
                    bVar60)) {
            bVar60 = true;
            goto LAB_0010e1b6;
          }
          goto LAB_0010e225;
        }
        local_88fc = 0;
        if (asVar21 != (stbi_uc  [4])0x18) goto LAB_0010e225;
        local_88fc = s->img_x & 3;
        bVar60 = false;
LAB_0010e1b6:
        bVar8 = false;
        iVar22 = 0;
        iVar42 = 0;
        iVar55 = 0;
        iVar39 = 0;
        uVar27 = 0;
        uVar24 = 0;
        local_890c = 0;
        local_88c4 = 0;
LAB_0010e399:
        iVar23 = 0;
        for (iVar54 = 0; sVar17 = s->img_y, iVar54 < (int)sVar17; iVar54 = iVar54 + 1) {
          if (bVar8) {
            for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 1) {
              if (asVar21 == (stbi_uc  [4])0x10) {
                uVar25 = stbi__get16le(s);
              }
              else {
                uVar25 = stbi__get32le(s);
              }
              iVar26 = stbi__shiftsigned(uVar25 & uStack_88ec,iVar22,uVar27);
              puVar33[iVar23] = (uchar)iVar26;
              iVar26 = stbi__shiftsigned(uVar25 & local_88e8,iVar42,uVar24);
              puVar33[(long)iVar23 + 1] = (uchar)iVar26;
              iVar26 = stbi__shiftsigned(uVar25 & uStack_88e4,iVar55,local_890c);
              puVar33[(long)iVar23 + 2] = (uchar)iVar26;
              if (uStack_88e0 == 0) {
                uVar25 = 0xff;
              }
              else {
                uVar25 = stbi__shiftsigned(uVar25 & uStack_88e0,iVar39,local_88c4);
              }
              iVar26 = iVar23 + 3;
              if (iVar16 == 4) {
                puVar33[(long)iVar23 + 3] = (uchar)uVar25;
                iVar26 = iVar23 + 4;
              }
              iVar23 = iVar26;
              local_8968 = local_8968 | uVar25;
            }
          }
          else {
            for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 1) {
              sVar9 = stbi__get8(s);
              puVar33[(long)iVar23 + 2] = sVar9;
              sVar9 = stbi__get8(s);
              puVar33[(long)iVar23 + 1] = sVar9;
              sVar9 = stbi__get8(s);
              puVar33[iVar23] = sVar9;
              bVar12 = 0xff;
              if (bVar60) {
                bVar12 = stbi__get8(s);
              }
              iVar26 = iVar23 + 3;
              if (iVar16 == 4) {
                puVar33[(long)iVar23 + 3] = bVar12;
                iVar26 = iVar23 + 4;
              }
              iVar23 = iVar26;
              local_8968 = local_8968 | bVar12;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_0010e7a2:
        if ((iVar16 == 4) && (local_8968 == 0)) {
          for (uVar27 = s->img_x * sVar17 * 4 - 1; -1 < (int)uVar27; uVar27 = uVar27 - 4) {
            puVar33[uVar27] = 0xff;
          }
        }
        if (0 < (int)uVar18) {
          iVar22 = (int)sVar17 >> 1;
          if ((int)sVar17 >> 1 < 1) {
            iVar22 = 0;
          }
          iVar39 = (sVar17 - 1) * iVar16;
          iVar55 = 0;
          for (iVar42 = 0; iVar42 != iVar22; iVar42 = iVar42 + 1) {
            sVar19 = s->img_x;
            uVar18 = sVar19 * iVar16;
            if ((int)(sVar19 * iVar16) < 1) {
              uVar18 = 0;
            }
            for (uVar48 = 0; uVar18 != uVar48; uVar48 = uVar48 + 1) {
              uVar2 = puVar33[uVar48 + sVar19 * iVar55];
              puVar33[uVar48 + sVar19 * iVar55] = puVar33[uVar48 + sVar19 * iVar39];
              puVar33[uVar48 + sVar19 * iVar39] = uVar2;
            }
            iVar39 = iVar39 - iVar16;
            iVar55 = iVar55 + iVar16;
          }
        }
        uVar18 = s->img_x;
        if ((req_comp != 0) && (iVar16 != req_comp)) {
          puVar33 = stbi__convert_format(puVar33,iVar16,req_comp,uVar18,sVar17);
          if (puVar33 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar18 = s->img_x;
        }
        *x = uVar18;
        *y = s->img_y;
        if (comp == (int *)0x0) {
          return puVar33;
        }
        *comp = s->img_n;
        return puVar33;
      }
      local_88fc = s->img_x * 2 & 2;
LAB_0010e225:
      if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
        iVar22 = stbi__high_bit(uStack_88ec);
        uVar27 = stbi__bitcount(uStack_88ec);
        iVar42 = stbi__high_bit(local_88e8);
        uVar24 = stbi__bitcount(local_88e8);
        iVar55 = stbi__high_bit(uStack_88e4);
        local_890c = stbi__bitcount(uStack_88e4);
        iVar39 = stbi__high_bit(uStack_88e0);
        local_88c4 = stbi__bitcount(uStack_88e0);
        if ((local_890c < 9 && (uVar24 < 9 && uVar27 < 9)) && local_88c4 < 9) {
          iVar22 = iVar22 + -7;
          iVar42 = iVar42 + -7;
          iVar55 = iVar55 + -7;
          iVar39 = iVar39 + -7;
          bVar8 = true;
          bVar60 = false;
          goto LAB_0010e399;
        }
      }
      free(puVar33);
      pcVar28 = "bad masks";
      goto LAB_0010c61d;
    }
LAB_0010dfe2:
    pcVar28 = "outofmem";
    goto LAB_0010c61d;
  }
LAB_0010c7ae:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar16 = stbi__gif_test(s);
  if (iVar16 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    local_8980 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar59);
    if (local_8980 == (stbi__context *)0x0 || local_8980 == s) {
      free((void *)pal._8_8_);
      local_8980 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        local_8980 = (stbi__context *)
                     stbi__convert_format((uchar *)local_8980,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    psVar30 = (stbi__jpeg *)pal._16_8_;
    goto LAB_0010ca0c;
  }
  sVar17 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar17 == 0x38425053) {
    sVar17 = stbi__get32be(s);
    if (sVar17 != 0x38425053) {
      pcVar28 = "not PSD";
      goto LAB_0010c61d;
    }
    iVar16 = stbi__get16be(s);
    if (iVar16 != 1) {
      pcVar28 = "wrong version";
      goto LAB_0010c61d;
    }
    stbi__skip(s,6);
    uVar18 = stbi__get16be(s);
    if (0x10 < uVar18) {
      pcVar28 = "wrong channel count";
      goto LAB_0010c61d;
    }
    sVar17 = stbi__get32be(s);
    sVar19 = stbi__get32be(s);
    if (((int)sVar17 < 0x1000001) && ((int)sVar19 < 0x1000001)) {
      iVar16 = stbi__get16be(s);
      if ((iVar16 != 8) && (iVar16 != 0x10)) {
        pcVar28 = "unsupported bit depth";
        goto LAB_0010c61d;
      }
      iVar22 = stbi__get16be(s);
      if (iVar22 != 3) {
        pcVar28 = "wrong color format";
        goto LAB_0010c61d;
      }
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      uVar27 = stbi__get16be(s);
      if (1 < uVar27) {
        pcVar28 = "bad compression";
        goto LAB_0010c61d;
      }
      iVar22 = stbi__mad3sizes_valid(4,sVar19,sVar17,0);
      if (iVar22 != 0) {
        if (((bpc == 0x10) && (iVar16 == 0x10)) && (uVar27 == 0)) {
          local_8980 = (stbi__context *)stbi__malloc_mad3(8,sVar19,sVar17,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8980 = (stbi__context *)malloc((long)(int)(sVar17 * sVar19 * 4));
        }
        if (local_8980 != (stbi__context *)0x0) {
          uVar24 = sVar19 * sVar17;
          if (uVar27 == 0) {
            uVar48 = 0;
            psVar49 = (stbi__uint16 *)local_8980;
            psVar51 = (stbi__uint16 *)local_8980;
            uVar27 = 0;
            if (0 < (int)uVar24) {
              uVar27 = uVar24;
            }
            for (; uVar48 != 4; uVar48 = uVar48 + 1) {
              if (uVar48 < uVar18) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar36 = 0; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                    iVar22 = stbi__get16be(s);
                    psVar49[lVar36 * 4] = (stbi__uint16)iVar22;
                  }
                }
                else {
                  lVar36 = 0;
                  if (iVar16 == 0x10) {
                    for (; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      iVar22 = stbi__get16be(s);
                      *(char *)(psVar51 + lVar36 * 2) = (char)((uint)iVar22 >> 8);
                    }
                  }
                  else {
                    for (; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      sVar9 = stbi__get8(s);
                      *(stbi_uc *)(psVar51 + lVar36 * 2) = sVar9;
                    }
                  }
                }
              }
              else if (iVar16 == 0x10 && bpc == 0x10) {
                for (lVar36 = 0; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  psVar49[lVar36 * 4] = -(ushort)(uVar48 == 3);
                }
              }
              else {
                for (lVar36 = 0; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  *(char *)(psVar51 + lVar36 * 2) = -(uVar48 == 3);
                }
              }
              psVar49 = psVar49 + 1;
              psVar51 = (stbi__uint16 *)((long)psVar51 + 1);
            }
          }
          else {
            stbi__skip(s,sVar17 * uVar18 * 2);
            uVar48 = 0;
            psVar49 = (stbi__uint16 *)local_8980;
            uVar27 = 0;
            if (0 < (int)uVar24) {
              uVar27 = uVar24;
            }
            for (; uVar48 != 4; uVar48 = uVar48 + 1) {
              if (uVar48 < uVar18) {
                psVar59 = (stbi_uc *)((long)local_8980 + uVar48);
                iVar16 = 0;
                do {
                  uVar25 = uVar24 - iVar16;
                  do {
                    if ((int)uVar25 < 1) goto LAB_0010eb67;
                    bVar12 = stbi__get8(s);
                  } while (bVar12 == 0x80);
                  uVar56 = (uint)bVar12;
                  if ((char)bVar12 < '\0') {
                    uVar47 = 0x101 - uVar56;
                    if (uVar25 < uVar47) goto LAB_0010f976;
                    sVar9 = stbi__get8(s);
                    for (iVar22 = uVar56 - 0x101; iVar22 != 0; iVar22 = iVar22 + 1) {
                      *psVar59 = sVar9;
                      psVar59 = psVar59 + 4;
                    }
                  }
                  else {
                    if (uVar25 <= bVar12) {
LAB_0010f976:
                      free(local_8980);
                      pcVar28 = "corrupt";
                      goto LAB_0010c61d;
                    }
                    uVar47 = uVar56 + 1;
                    uVar25 = uVar47;
                    while (bVar60 = uVar25 != 0, uVar25 = uVar25 - 1, bVar60) {
                      sVar9 = stbi__get8(s);
                      *psVar59 = sVar9;
                      psVar59 = psVar59 + 4;
                    }
                  }
                  iVar16 = iVar16 + uVar47;
                } while( true );
              }
              for (lVar36 = 0; uVar27 != (uint)lVar36; lVar36 = lVar36 + 1) {
                *(char *)(psVar49 + lVar36 * 2) = -(uVar48 == 3);
              }
LAB_0010eb67:
              psVar49 = (stbi__uint16 *)((long)psVar49 + 1);
            }
          }
          if (3 < uVar18) {
            uVar48 = 0;
            if (0 < (int)uVar24) {
              uVar48 = (ulong)uVar24;
            }
            if (ri->bits_per_channel == 0x10) {
              for (uVar53 = 0; uVar48 != uVar53; uVar53 = uVar53 + 1) {
                uVar5 = *(ushort *)((long)local_8980 + (uVar53 * 4 + 3) * 2);
                if ((uVar5 != 0) && (uVar5 != 0xffff)) {
                  fVar62 = 1.0 / ((float)uVar5 / 65535.0);
                  fVar61 = (1.0 - fVar62) * 65535.0;
                  auVar63._0_4_ =
                       (int)(fVar61 + fVar62 * (float)(*(uint *)((long)local_8980 + uVar53 * 4 * 2)
                                                      & 0xffff));
                  auVar63._4_4_ =
                       (int)(fVar61 + fVar62 * (float)(*(uint *)((long)local_8980 + uVar53 * 4 * 2)
                                                      >> 0x10));
                  auVar63._8_4_ = (int)(fVar61 + fVar62 * 0.0);
                  auVar63._12_4_ = (int)(fVar61 + fVar62 * 0.0);
                  auVar63 = pshuflw(auVar63,auVar63,0xe8);
                  *(int *)((long)local_8980 + uVar53 * 4 * 2) = auVar63._0_4_;
                  *(stbi__uint16 *)((long)local_8980 + (uVar53 * 4 + 2) * 2) =
                       (stbi__uint16)
                       (int)((float)*(ushort *)((long)local_8980 + (uVar53 * 4 + 2) * 2) * fVar62 +
                            fVar61);
                }
              }
            }
            else {
              for (uVar53 = 0; uVar48 != uVar53; uVar53 = uVar53 + 1) {
                bVar12 = *(byte *)((long)local_8980 + uVar53 * 4 + 3);
                if ((bVar12 != 0) && (bVar12 != 0xff)) {
                  fVar62 = 1.0 / ((float)bVar12 / 255.0);
                  fVar61 = (1.0 - fVar62) * 255.0;
                  *(char *)((long)local_8980 + uVar53 * 2 * 2) =
                       (char)(int)((float)(byte)*(stbi__uint16 *)((long)local_8980 + uVar53 * 2 * 2)
                                   * fVar62 + fVar61);
                  *(char *)((long)local_8980 + uVar53 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)local_8980 + uVar53 * 4 + 1) * fVar62 +
                                  fVar61);
                  *(char *)((long)local_8980 + (uVar53 * 2 + 1) * 2) =
                       (char)(int)((float)(byte)*(stbi__uint16 *)
                                                 ((long)local_8980 + (uVar53 * 2 + 1) * 2) * fVar62
                                  + fVar61);
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              local_8980 = (stbi__context *)
                           stbi__convert_format16
                                     ((stbi__uint16 *)local_8980,4,req_comp,sVar19,sVar17);
            }
            else {
              local_8980 = (stbi__context *)
                           stbi__convert_format((uchar *)local_8980,4,req_comp,sVar19,sVar17);
            }
            if (local_8980 == (stbi__context *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar17;
          *x = sVar19;
          return (stbi__uint16 *)local_8980;
        }
        goto LAB_0010dfe2;
      }
    }
  }
  else {
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_1723c);
    iVar22 = (int)psVar59;
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar16 = 0x54;
      while( true ) {
        iVar22 = (int)psVar59;
        bVar60 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar60) break;
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar60 = iVar16 != 0, iVar16 = iVar16 + -1, bVar60) {
          stbi__get8(s);
        }
        uVar18 = stbi__get16be(s);
        uVar27 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          pcVar28 = "bad file";
          goto LAB_0010c61d;
        }
        iVar16 = stbi__mad3sizes_valid(uVar18,uVar27,4,0);
        if (iVar16 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          local_8988 = (float *)stbi__malloc_mad3(uVar18,uVar27,4,0);
          if (local_8988 != (float *)0x0) {
            memset(local_8988,0xff,(ulong)(uVar18 * 4 * uVar27));
            psVar59 = pal[0] + 2;
            lVar36 = 0;
            uVar24 = uVar27;
            uVar25 = 0;
            do {
              if (lVar36 == 10) {
                *(char **)(in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_0010e99b;
              }
              sVar9 = stbi__get8(s);
              bVar12 = stbi__get8(s);
              (*(stbi_uc (*) [4])(psVar59 + -2))[0] = bVar12;
              bVar11 = stbi__get8(s);
              psVar59[-1] = bVar11;
              bVar11 = stbi__get8(s);
              *psVar59 = bVar11;
              iVar16 = stbi__at_eof(s);
              uVar24 = uVar25;
              if (iVar16 != 0) {
                pcVar28 = "bad file";
LAB_0010e07a:
                *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
                goto LAB_0010e99b;
              }
              if (bVar12 != 8) {
                pcVar28 = "bad format";
                goto LAB_0010e07a;
              }
              uVar25 = uVar25 | bVar11;
              psVar59 = psVar59 + 3;
              lVar36 = lVar36 + 1;
            } while (sVar9 != '\0');
            uVar24 = 4 - ((uVar25 & 0x10) == 0);
            if (comp != (int *)0x0) {
              *comp = uVar24;
            }
            for (uVar48 = 0; uVar48 != uVar27; uVar48 = uVar48 + 1) {
              psVar59 = (stbi_uc *)((long)local_8988 + (long)(int)(uVar18 * 4 * (int)uVar48));
              for (lVar32 = 0; lVar36 != lVar32; lVar32 = lVar32 + 1) {
                lVar6 = lVar32 * 3;
                sVar9 = pal[0][lVar6 + 1];
                psVar57 = psVar59;
                uVar25 = uVar18;
                if (sVar9 != '\0') {
                  if (sVar9 == '\x01') {
                    for (; 0 < (int)uVar25; uVar25 = uVar25 - (uVar56 & 0xff)) {
                      bVar12 = stbi__get8(s);
                      iVar16 = stbi__at_eof(s);
                      if (iVar16 != 0) goto LAB_0010e982;
                      psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
                      if (psVar31 == (stbi_uc *)0x0) goto LAB_0010e99b;
                      uVar56 = (uint)bVar12;
                      if (uVar25 < bVar12) {
                        uVar56 = uVar25;
                      }
                      uVar47 = uVar56 & 0xff;
                      while (bVar60 = uVar47 != 0, uVar47 = uVar47 - 1, bVar60) {
                        stbi__copyval((uint)pal[0][lVar6 + 2],psVar57,value);
                        psVar57 = psVar57 + 4;
                      }
                    }
                    goto LAB_0010d10d;
                  }
                  if (sVar9 == '\x02') {
                    for (; 0 < (int)uVar25; uVar25 = uVar25 - iVar16) {
                      bVar12 = stbi__get8(s);
                      iVar16 = stbi__at_eof(s);
                      if (iVar16 != 0) goto LAB_0010e982;
                      uVar56 = (uint)bVar12;
                      if ((char)bVar12 < '\0') {
                        if (uVar56 == 0x80) {
                          iVar16 = stbi__get16be(s);
                        }
                        else {
                          iVar16 = uVar56 - 0x7f;
                        }
                        if ((int)uVar25 < iVar16) goto LAB_0010e982;
                        psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
                        iVar22 = iVar16;
                        if (psVar31 == (stbi_uc *)0x0) goto LAB_0010e99b;
                        while (iVar22 != 0) {
                          stbi__copyval((uint)pal[0][lVar6 + 2],psVar57,value);
                          psVar57 = psVar57 + 4;
                          iVar22 = iVar22 + -1;
                        }
                      }
                      else {
                        iVar16 = bVar12 + 1;
                        iVar22 = iVar16;
                        if (uVar25 <= uVar56) goto LAB_0010e982;
                        while (bVar60 = iVar22 != 0, iVar22 = iVar22 + -1, bVar60) {
                          psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar57);
                          if (psVar31 == (stbi_uc *)0x0) goto LAB_0010e99b;
                          psVar57 = psVar57 + 4;
                        }
                      }
                    }
                    goto LAB_0010d10d;
                  }
                  pcVar28 = "bad format";
                  goto LAB_0010e989;
                }
                while (bVar60 = uVar25 != 0, uVar25 = uVar25 - 1, bVar60) {
                  psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar57);
                  if (psVar31 == (stbi_uc *)0x0) goto LAB_0010e99b;
                  psVar57 = psVar57 + 4;
                }
LAB_0010d10d:
              }
            }
            goto LAB_0010e9c4;
          }
          goto LAB_0010dfe2;
        }
        goto LAB_0010ed7e;
      }
    }
    psVar30 = (stbi__jpeg *)malloc(0x4888);
    if (psVar30 == (stbi__jpeg *)0x0) {
      *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    }
    else {
      psVar30->s = s;
      psVar30->idct_block_kernel = stbi__idct_simd;
      psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar16 = stbi__decode_jpeg_header(psVar30,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar30);
      if (iVar16 != 0) {
        psVar30 = (stbi__jpeg *)malloc(0x4888);
        if (psVar30 != (stbi__jpeg *)0x0) {
          psVar30->s = s;
          psVar30->idct_block_kernel = stbi__idct_simd;
          psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
          psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
          s->img_n = 0;
          if ((uint)req_comp < 5) {
            for (lVar36 = 0x46d8; lVar36 != 0x4858; lVar36 = lVar36 + 0x60) {
              psVar59 = psVar30->huff_dc[0].fast + lVar36 + -8;
              psVar59[0] = '\0';
              psVar59[1] = '\0';
              psVar59[2] = '\0';
              psVar59[3] = '\0';
              psVar59[4] = '\0';
              psVar59[5] = '\0';
              psVar59[6] = '\0';
              psVar59[7] = '\0';
              psVar59[8] = '\0';
              psVar59[9] = '\0';
              psVar59[10] = '\0';
              psVar59[0xb] = '\0';
              psVar59[0xc] = '\0';
              psVar59[0xd] = '\0';
              psVar59[0xe] = '\0';
              psVar59[0xf] = '\0';
            }
            psVar30->restart_interval = 0;
            iVar16 = stbi__decode_jpeg_header(psVar30,0);
            if (iVar16 != 0) {
              paVar1 = psVar30->img_comp;
              bVar12 = stbi__get_marker(psVar30);
LAB_0010d3df:
              if (bVar12 != 0xda) {
                if (bVar12 == 0xdc) {
                  iVar16 = stbi__get16be(psVar30->s);
                  sVar17 = stbi__get16be(psVar30->s);
                  if (iVar16 == 4) {
                    if (sVar17 == psVar30->s->img_y) goto LAB_0010d442;
                    pcVar28 = "bad DNL height";
                  }
                  else {
                    pcVar28 = "bad DNL len";
                  }
                  goto LAB_0010ef7f;
                }
                if (bVar12 != 0xd9) {
                  iVar16 = stbi__process_marker(psVar30,(uint)bVar12);
                  if (iVar16 != 0) goto LAB_0010d442;
                  goto LAB_0010ef88;
                }
                if (psVar30->progressive == 0) {
                  psVar41 = psVar30->s;
                  uVar18 = psVar41->img_n;
                }
                else {
                  lVar36 = 0;
                  while( true ) {
                    psVar41 = psVar30->s;
                    uVar18 = psVar41->img_n;
                    if ((int)uVar18 <= lVar36) break;
                    uVar18 = psVar30->img_comp[lVar36].x + 7 >> 3;
                    iVar16 = psVar30->img_comp[lVar36].y + 7 >> 3;
                    uVar53 = 0;
                    uVar48 = (ulong)uVar18;
                    if ((int)uVar18 < 1) {
                      uVar48 = uVar53;
                    }
                    if (iVar16 < 1) {
                      iVar16 = 0;
                    }
                    while (iVar22 = (int)uVar53, iVar22 != iVar16) {
                      for (uVar53 = 0; uVar53 != uVar48; uVar53 = uVar53 + 1) {
                        psVar58 = paVar1[lVar36].coeff;
                        iVar39 = paVar1[lVar36].coeff_w * iVar22;
                        iVar55 = paVar1[lVar36].tq;
                        iVar42 = iVar39 + (int)uVar53;
                        for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 1) {
                          psVar58[iVar42 * 0x40 + lVar32] =
                               psVar58[iVar42 * 0x40 + lVar32] * psVar30->dequant[iVar55][lVar32];
                        }
                        (*psVar30->idct_block_kernel)
                                  (paVar1[lVar36].data +
                                   uVar53 * 8 + (long)(iVar22 * 8 * paVar1[lVar36].w2),
                                   paVar1[lVar36].w2,psVar58 + (iVar39 + (int)uVar53) * 0x40);
                      }
                      uVar53 = (ulong)(iVar22 + 1);
                    }
                    lVar36 = lVar36 + 1;
                  }
                }
                uVar27 = (2 < (int)uVar18) + 1 + (uint)(2 < (int)uVar18);
                if (req_comp != 0) {
                  uVar27 = req_comp;
                }
                local_8940 = (ulong)uVar27;
                if (uVar18 == 3) {
                  bVar60 = true;
                  if (psVar30->rgb != 3) {
                    if (psVar30->app14_color_transform != 0) goto LAB_0010efe4;
                    bVar60 = psVar30->jfif == 0;
                  }
                }
                else {
LAB_0010efe4:
                  bVar60 = false;
                }
                uVar24 = 1;
                if (bVar60) {
                  uVar24 = uVar18;
                }
                if (2 < (int)uVar27) {
                  uVar24 = uVar18;
                }
                if (uVar18 != 3) {
                  uVar24 = uVar18;
                }
                if ((int)uVar24 < 1) {
                  stbi__cleanup_jpeg(psVar30);
                  goto LAB_0010ef95;
                }
                _value = (stbi_uc *)0x0;
                sVar17 = psVar41->img_x;
                for (lVar36 = 0; (ulong)uVar24 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                  pvVar29 = malloc((ulong)(sVar17 + 3));
                  *(void **)((long)&psVar30->img_comp[0].linebuf + lVar36 * 2) = pvVar29;
                  if (pvVar29 == (void *)0x0) goto LAB_0010f9e2;
                  uVar48 = (long)psVar30->img_h_max /
                           (long)*(int *)((long)&psVar30->img_comp[0].h + lVar36 * 2);
                  iVar16 = (int)uVar48;
                  *(int *)(pal[6] + lVar36) = iVar16;
                  iVar22 = psVar30->img_v_max / *(int *)((long)&psVar30->img_comp[0].v + lVar36 * 2)
                  ;
                  *(int *)(pal[7] + lVar36) = iVar22;
                  *(int *)(pal[9] + lVar36) = iVar22 >> 1;
                  *(int *)(pal[8] + lVar36) =
                       (int)((ulong)(iVar16 + (sVar17 - 1)) / (uVar48 & 0xffffffff));
                  psVar59 = pal[10] + lVar36;
                  psVar59[0] = '\0';
                  psVar59[1] = '\0';
                  psVar59[2] = '\0';
                  psVar59[3] = '\0';
                  uVar35 = *(undefined8 *)((long)&psVar30->img_comp[0].data + lVar36 * 2);
                  *(undefined8 *)(pal[4] + lVar36) = uVar35;
                  *(undefined8 *)(pal[2] + lVar36) = uVar35;
                  if (iVar16 == 2) {
                    pcVar34 = stbi__resample_row_h_2;
                    if (iVar22 != 1) {
                      if (iVar22 != 2) goto LAB_0010f110;
                      pcVar34 = psVar30->resample_row_hv_2_kernel;
                    }
                  }
                  else if (iVar16 == 1) {
                    pcVar34 = stbi__resample_row_generic;
                    if (iVar22 == 2) {
                      pcVar34 = stbi__resample_row_v_2;
                    }
                    if (iVar22 == 1) {
                      pcVar34 = resample_row_1;
                    }
                  }
                  else {
LAB_0010f110:
                    pcVar34 = stbi__resample_row_generic;
                  }
                  *(code **)(pal[0] + lVar36) = pcVar34;
                }
                sVar19 = psVar41->img_y;
                local_8980 = (stbi__context *)stbi__malloc_mad3(uVar27,sVar17,sVar19,1);
                if (local_8980 != (stbi__context *)0x0) {
                  iVar16 = 0;
                  uVar18 = 0;
                  do {
                    if (sVar19 <= uVar18) {
                      stbi__cleanup_jpeg(psVar30);
                      psVar41 = psVar30->s;
                      *x = psVar41->img_x;
                      *y = psVar41->img_y;
                      if (comp != (int *)0x0) {
                        *comp = (uint)(2 < psVar41->img_n) * 2 + 1;
                      }
                      goto LAB_0010ca0c;
                    }
                    sVar17 = psVar41->img_x;
                    psVar59 = value;
                    for (lVar36 = 0; (ulong)uVar24 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
                      iVar22 = *(int *)(pal[9] + lVar36);
                      iVar55 = *(int *)(pal[7] + lVar36);
                      iVar39 = iVar55 >> 1;
                      psVar57 = pal[4] + lVar36;
                      if (iVar22 < iVar39) {
                        psVar57 = pal[2] + lVar36;
                      }
                      psVar31 = pal[4] + lVar36;
                      if (iVar39 <= iVar22) {
                        psVar31 = pal[2] + lVar36;
                      }
                      uVar35 = (**(code **)(pal[0] + lVar36))
                                         (*(undefined8 *)
                                           ((long)&psVar30->img_comp[0].linebuf + lVar36 * 2),
                                          *(undefined8 *)psVar57,*(undefined8 *)psVar31,
                                          *(undefined4 *)(pal[8] + lVar36));
                      *(undefined8 *)psVar59 = uVar35;
                      *(int *)(pal[9] + lVar36) = iVar22 + 1;
                      if (iVar55 <= iVar22 + 1) {
                        psVar57 = pal[9] + lVar36;
                        psVar57[0] = '\0';
                        psVar57[1] = '\0';
                        psVar57[2] = '\0';
                        psVar57[3] = '\0';
                        lVar32 = *(long *)(pal[4] + lVar36);
                        *(long *)(pal[2] + lVar36) = lVar32;
                        iVar22 = *(int *)(pal[10] + lVar36) + 1;
                        *(int *)(pal[10] + lVar36) = iVar22;
                        if (iVar22 < *(int *)((long)&psVar30->img_comp[0].y + lVar36 * 2)) {
                          *(long *)(pal[4] + lVar36) =
                               lVar32 + *(int *)((long)&psVar30->img_comp[0].w2 + lVar36 * 2);
                        }
                      }
                      psVar59 = psVar59 + 8;
                    }
                    if ((int)uVar27 < 3) {
                      psVar41 = psVar30->s;
                      if (bVar60) {
                        psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x38);
                        pbVar45 = (byte *)0x0;
                        if (uVar27 == 1) {
                          for (; pbVar45 < (byte *)(ulong)psVar41->img_x; pbVar45 = pbVar45 + 1) {
                            psVar59[(long)pbVar45] =
                                 (stbi_uc)((uint)*pbVar45 * 0x1d +
                                           (uint)*pbVar45 * 0x96 +
                                           (uint)_value[(long)pbVar45] * 0x4d >> 8);
                          }
                        }
                        else {
                          for (; pbVar45 < (byte *)(ulong)psVar41->img_x; pbVar45 = pbVar45 + 1) {
                            psVar59[(long)pbVar45 * 2] =
                                 (stbi_uc)((uint)*pbVar45 * 0x1d +
                                           (uint)*pbVar45 * 0x96 +
                                           (uint)_value[(long)pbVar45] * 0x4d >> 8);
                            psVar59[(long)pbVar45 * 2 + 1] = 0xff;
                          }
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar30->app14_color_transform == 2) {
                          psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x37);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            iVar22 = (_value[(long)pbVar45] ^ 0xff) * (uint)*pbVar45;
                            psVar59[-1] = (char)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + local_8940;
                          }
                        }
                        else {
                          if (psVar30->app14_color_transform != 0) goto LAB_0010f750;
                          psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x37);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar22 = (uint)_value[(long)pbVar45] * (uint)bVar12;
                            iVar55 = (uint)*pbVar45 * (uint)bVar12;
                            psVar59[-1] = (char)((((uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) +
                                                  (uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) * 0x1d
                                                 + (iVar55 + (iVar55 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar22 + (iVar22 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + local_8940;
                          }
                        }
                      }
                      else {
LAB_0010f750:
                        if (uVar27 == 1) {
                          for (uVar48 = 0; uVar48 < psVar41->img_x; uVar48 = uVar48 + 1) {
                            local_8980->buffer_start[uVar48 + sVar17 * iVar16 + -0x38] =
                                 _value[uVar48];
                          }
                        }
                        else {
                          for (uVar48 = 0; uVar48 < psVar41->img_x; uVar48 = uVar48 + 1) {
                            local_8980->buffer_start[uVar48 * 2 + (ulong)(sVar17 * iVar16) + -0x38]
                                 = _value[uVar48];
                            local_8980->buffer_start[uVar48 * 2 + (ulong)(sVar17 * iVar16) + -0x37]
                                 = 0xff;
                          }
                        }
                      }
                    }
                    else {
                      psVar59 = local_8980->buffer_start +
                                ((ulong)(uVar18 * uVar27 * sVar17) - 0x38);
                      psVar41 = psVar30->s;
                      if (psVar41->img_n == 3) {
                        if (bVar60) {
                          psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                          for (puVar43 = (undefined1 *)0x0;
                              puVar43 < (undefined1 *)(ulong)psVar41->img_x; puVar43 = puVar43 + 1)
                          {
                            psVar59[-3] = _value[(long)puVar43];
                            psVar59[-2] = *puVar43;
                            psVar59[-1] = *puVar43;
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + local_8940;
                          }
                        }
                        else {
                          (*psVar30->YCbCr_to_RGB_kernel)
                                    (psVar59,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar27);
                        }
                      }
                      else if (psVar41->img_n == 4) {
                        if (psVar30->app14_color_transform == 2) {
                          (*psVar30->YCbCr_to_RGB_kernel)
                                    (psVar59,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar27);
                          psVar41 = psVar30->s;
                          psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x36);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar22 = (psVar59[-2] ^ 0xff) * (uint)bVar12;
                            psVar59[-2] = (byte)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            iVar22 = (psVar59[-1] ^ 0xff) * (uint)bVar12;
                            psVar59[-1] = (byte)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            iVar22 = (*psVar59 ^ 0xff) * (uint)bVar12;
                            *psVar59 = (byte)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            psVar59 = psVar59 + local_8940;
                          }
                        }
                        else if (psVar30->app14_color_transform == 0) {
                          psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                          for (pbVar45 = (byte *)0x0; pbVar45 < (byte *)(ulong)psVar41->img_x;
                              pbVar45 = pbVar45 + 1) {
                            bVar12 = *pbVar45;
                            iVar22 = (uint)_value[(long)pbVar45] * (uint)bVar12;
                            psVar59[-3] = (char)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            iVar22 = (uint)*pbVar45 * (uint)bVar12;
                            psVar59[-2] = (char)((iVar22 + 0x80U >> 8) + iVar22 + 0x80 >> 8);
                            psVar59[-1] = (char)(((uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8) +
                                                 (uint)*pbVar45 * (uint)bVar12 + 0x80 >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + local_8940;
                          }
                        }
                        else {
                          (*psVar30->YCbCr_to_RGB_kernel)
                                    (psVar59,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar41->img_x,
                                     uVar27);
                        }
                      }
                      else {
                        psVar59 = local_8980->buffer_start + ((ulong)(sVar17 * iVar16) - 0x35);
                        for (uVar48 = 0; uVar48 < psVar41->img_x; uVar48 = uVar48 + 1) {
                          sVar9 = _value[uVar48];
                          psVar59[-1] = sVar9;
                          psVar59[-2] = sVar9;
                          psVar59[-3] = sVar9;
                          *psVar59 = 0xff;
                          psVar59 = psVar59 + local_8940;
                        }
                      }
                    }
                    uVar18 = uVar18 + 1;
                    psVar41 = psVar30->s;
                    sVar19 = psVar41->img_y;
                    iVar16 = iVar16 + uVar27;
                  } while( true );
                }
LAB_0010f9e2:
                stbi__cleanup_jpeg(psVar30);
                *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
                local_8980 = (stbi__context *)0x0;
                goto LAB_0010ca0c;
              }
              iVar16 = stbi__get16be(psVar30->s);
              bVar12 = stbi__get8(psVar30->s);
              uVar18 = (uint)bVar12;
              psVar30->scan_n = (uint)bVar12;
              if (((byte)(bVar12 - 5) < 0xfc) ||
                 (psVar41 = psVar30->s, psVar41->img_n < (int)(uint)bVar12)) {
                pcVar28 = "bad SOS component count";
              }
              else {
                if (iVar16 != (uint)bVar12 * 2 + 6) {
                  pcVar28 = "bad SOS len";
                  goto LAB_0010ef7f;
                }
                lVar36 = 0;
                while( true ) {
                  bVar12 = stbi__get8(psVar41);
                  if ((int)uVar18 <= lVar36) break;
                  bVar11 = stbi__get8(psVar30->s);
                  psVar41 = psVar30->s;
                  uVar18 = psVar41->img_n;
                  uVar48 = 0;
                  if (0 < (int)uVar18) {
                    uVar48 = (ulong)uVar18;
                  }
                  paVar44 = paVar1;
                  for (uVar53 = 0; uVar48 != uVar53; uVar53 = uVar53 + 1) {
                    if (paVar44->id == (uint)bVar12) {
                      uVar48 = uVar53 & 0xffffffff;
                      break;
                    }
                    paVar44 = paVar44 + 1;
                  }
                  if ((uint)uVar48 == uVar18) goto LAB_0010ef88;
                  psVar30->img_comp[uVar48].hd = (uint)(bVar11 >> 4);
                  if (0x3f < bVar11) {
                    pcVar28 = "bad DC huff";
                    goto LAB_0010ef7f;
                  }
                  paVar1[uVar48].ha = bVar11 & 0xf;
                  if (3 < (bVar11 & 0xf)) {
                    pcVar28 = "bad AC huff";
                    goto LAB_0010ef7f;
                  }
                  psVar30->order[lVar36] = (uint)uVar48;
                  lVar36 = lVar36 + 1;
                  uVar18 = psVar30->scan_n;
                }
                psVar30->spec_start = (uint)bVar12;
                bVar12 = stbi__get8(psVar30->s);
                psVar30->spec_end = (uint)bVar12;
                bVar12 = stbi__get8(psVar30->s);
                psVar30->succ_high = (uint)(bVar12 >> 4);
                psVar30->succ_low = bVar12 & 0xf;
                iVar16 = psVar30->spec_start;
                if (psVar30->progressive == 0) {
                  if (((iVar16 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                    psVar30->spec_end = 0x3f;
                    goto LAB_0010d5e0;
                  }
                }
                else if (((iVar16 < 0x40) && (psVar30->spec_end < 0x40)) &&
                        ((iVar16 <= psVar30->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe)))
                         ))) {
LAB_0010d5e0:
                  stbi__jpeg_reset(psVar30);
                  if (psVar30->progressive == 0) {
                    if (psVar30->scan_n == 1) {
                      iVar16 = psVar30->order[0];
                      uVar18 = psVar30->img_comp[iVar16].x + 7 >> 3;
                      iVar22 = psVar30->img_comp[iVar16].y + 7 >> 3;
                      if ((int)uVar18 < 1) {
                        uVar18 = 0;
                      }
                      iVar55 = 0;
                      if (iVar22 < 1) {
                        iVar22 = 0;
                      }
                      for (iVar39 = 0; iVar39 != iVar22; iVar39 = iVar39 + 1) {
                        for (lVar36 = 0; (ulong)uVar18 * 8 != lVar36; lVar36 = lVar36 + 8) {
                          iVar42 = stbi__jpeg_decode_block
                                             (psVar30,(short *)pal,
                                              (stbi__huffman *)
                                              psVar30->huff_dc[paVar1[iVar16].hd].fast,
                                              (stbi__huffman *)
                                              psVar30->huff_ac[paVar1[iVar16].ha].fast,
                                              psVar30->fast_ac[paVar1[iVar16].ha],iVar16,
                                              psVar30->dequant[paVar1[iVar16].tq]);
                          if (iVar42 == 0) {
                            bVar60 = false;
                            goto LAB_0010de81;
                          }
                          (*psVar30->idct_block_kernel)
                                    (paVar1[iVar16].data + lVar36 + iVar55 * paVar1[iVar16].w2,
                                     paVar1[iVar16].w2,(short *)pal);
                          iVar42 = psVar30->todo;
                          psVar30->todo = iVar42 + -1;
                          if (iVar42 < 2) {
                            if (psVar30->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar30);
                            }
                            if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_0010de7e;
                            stbi__jpeg_reset(psVar30);
                          }
                        }
                        iVar55 = iVar55 + 8;
                      }
LAB_0010de7e:
                      bVar60 = true;
                    }
                    else {
                      for (iVar16 = 0; iVar16 < psVar30->img_mcu_y; iVar16 = iVar16 + 1) {
                        for (iVar22 = 0; iVar22 < psVar30->img_mcu_x; iVar22 = iVar22 + 1) {
                          for (lVar36 = 0; lVar36 < psVar30->scan_n; lVar36 = lVar36 + 1) {
                            iVar55 = psVar30->order[lVar36];
                            for (iVar39 = 0; iVar39 < paVar1[iVar55].v; iVar39 = iVar39 + 1) {
                              for (iVar42 = 0; iVar23 = paVar1[iVar55].h, iVar42 < iVar23;
                                  iVar42 = iVar42 + 1) {
                                iVar54 = paVar1[iVar55].v;
                                iVar52 = stbi__jpeg_decode_block
                                                   (psVar30,(short *)pal,
                                                    (stbi__huffman *)
                                                    psVar30->huff_dc[paVar1[iVar55].hd].fast,
                                                    (stbi__huffman *)
                                                    psVar30->huff_ac[paVar1[iVar55].ha].fast,
                                                    psVar30->fast_ac[paVar1[iVar55].ha],iVar55,
                                                    psVar30->dequant[paVar1[iVar55].tq]);
                                if (iVar52 == 0) {
                                  bVar60 = false;
                                  goto LAB_0010de81;
                                }
                                (*psVar30->idct_block_kernel)
                                          (paVar1[iVar55].data +
                                           (long)((iVar23 * iVar22 + iVar42) * 8) +
                                           (long)((iVar54 * iVar16 + iVar39) * paVar1[iVar55].w2 * 8
                                                 ),paVar1[iVar55].w2,(short *)pal);
                              }
                            }
                          }
                          iVar55 = psVar30->todo;
                          psVar30->todo = iVar55 + -1;
                          if (iVar55 < 2) {
                            if (psVar30->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar30);
                            }
                            if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_0010ded7;
                            stbi__jpeg_reset(psVar30);
                          }
                        }
                      }
LAB_0010ded7:
                      bVar60 = true;
                    }
LAB_0010de81:
                    if (!bVar60) goto LAB_0010ef88;
                  }
                  else if (psVar30->scan_n == 1) {
                    iVar16 = psVar30->order[0];
                    iVar55 = psVar30->img_comp[iVar16].x + 7 >> 3;
                    iVar22 = psVar30->img_comp[iVar16].y + 7 >> 3;
                    iVar39 = 0;
                    if (iVar55 < 1) {
                      iVar55 = 0;
                    }
                    if (iVar22 < 1) {
                      iVar22 = iVar39;
                    }
                    for (; iVar39 != iVar22; iVar39 = iVar39 + 1) {
                      for (iVar42 = 0; iVar42 != iVar55; iVar42 = iVar42 + 1) {
                        psVar58 = paVar1[iVar16].coeff +
                                  (paVar1[iVar16].coeff_w * iVar39 + iVar42) * 0x40;
                        uVar48 = (ulong)psVar30->spec_start;
                        if (uVar48 == 0) {
                          iVar23 = stbi__jpeg_decode_block_prog_dc
                                             (psVar30,psVar58,
                                              (stbi__huffman *)
                                              psVar30->huff_dc[paVar1[iVar16].hd].fast,iVar16);
                          if (iVar23 == 0) goto LAB_0010ef88;
                        }
                        else {
                          iVar23 = paVar1[iVar16].ha;
                          psVar59 = psVar30->huff_ac[iVar23].fast;
                          iVar54 = psVar30->eob_run;
                          bVar12 = (byte)psVar30->succ_low;
                          if (psVar30->succ_high == 0) {
                            if (iVar54 == 0) {
                              do {
                                if (psVar30->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar30);
                                }
                                sVar38 = psVar30->fast_ac[iVar23][psVar30->code_buffer >> 0x17];
                                uVar18 = (uint)sVar38;
                                iVar54 = (int)uVar48;
                                if (sVar38 == 0) {
                                  uVar18 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar59);
                                  if ((int)uVar18 < 0) goto LAB_0010ea07;
                                  uVar27 = uVar18 >> 4;
                                  if ((uVar18 & 0xf) == 0) {
                                    if (uVar18 < 0xf0) {
                                      iVar54 = 1 << ((byte)uVar27 & 0x1f);
                                      psVar30->eob_run = iVar54;
                                      if (0xf < uVar18) {
                                        iVar54 = stbi__jpeg_get_bits(psVar30,uVar27);
                                        iVar54 = iVar54 + psVar30->eob_run;
                                      }
                                      goto LAB_0010d78d;
                                    }
                                    uVar48 = (ulong)(iVar54 + 0x10);
                                  }
                                  else {
                                    lVar36 = (ulong)uVar27 + (long)iVar54;
                                    uVar48 = (ulong)((int)lVar36 + 1);
                                    bVar11 = ""[lVar36];
                                    iVar54 = stbi__extend_receive(psVar30,uVar18 & 0xf);
                                    psVar58[bVar11] = (short)(iVar54 << (bVar12 & 0x1f));
                                  }
                                }
                                else {
                                  lVar36 = (ulong)(uVar18 >> 4 & 0xf) + (long)iVar54;
                                  psVar30->code_buffer =
                                       psVar30->code_buffer << (sbyte)(uVar18 & 0xf);
                                  psVar30->code_bits = psVar30->code_bits - (uVar18 & 0xf);
                                  uVar48 = (ulong)((int)lVar36 + 1);
                                  psVar58[""[lVar36]] = (short)((uVar18 >> 8) << (bVar12 & 0x1f));
                                }
                              } while ((int)uVar48 <= psVar30->spec_end);
                            }
                            else {
LAB_0010d78d:
                              psVar30->eob_run = iVar54 + -1;
                            }
                          }
                          else if (iVar54 == 0) {
                            iVar23 = 0x10000 << (bVar12 & 0x1f);
                            do {
                              uVar18 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar59);
                              if ((int)uVar18 < 0) goto LAB_0010ea07;
                              uVar27 = uVar18 >> 4;
                              if ((uVar18 & 0xf) == 1) {
                                iVar54 = stbi__jpeg_get_bit(psVar30);
                                iVar52 = 1;
                                if (iVar54 == 0) {
                                  iVar52 = 0xffff;
                                }
                                sVar38 = (short)(iVar52 << (bVar12 & 0x1f));
                              }
                              else {
                                if ((uVar18 & 0xf) != 0) {
                                  pcVar28 = "bad huffman code";
                                  goto LAB_0010ef7f;
                                }
                                if (uVar18 < 0xf0) {
                                  psVar30->eob_run = ~(-1 << ((byte)uVar27 & 0x1f));
                                  if (0xf < uVar18) {
                                    iVar54 = stbi__jpeg_get_bits(psVar30,uVar27);
                                    psVar30->eob_run = psVar30->eob_run + iVar54;
                                  }
                                  uVar27 = 0x40;
                                }
                                else {
                                  uVar27 = 0xf;
                                }
                                sVar38 = 0;
                              }
                              uVar53 = (long)(int)uVar48;
                              do {
                                while( true ) {
                                  uVar48 = uVar53;
                                  iVar54 = psVar30->spec_end;
                                  if ((long)iVar54 < (long)uVar48) goto LAB_0010d8bc;
                                  bVar11 = ""[uVar48];
                                  if (psVar58[bVar11] == 0) break;
                                  iVar54 = stbi__jpeg_get_bit(psVar30);
                                  if ((iVar54 != 0) &&
                                     (sVar4 = psVar58[bVar11], (iVar23 >> 0x10 & (int)sVar4) == 0))
                                  {
                                    sVar7 = (short)((uint)iVar23 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar7 = -sVar7;
                                    }
                                    psVar58[bVar11] = sVar4 + sVar7;
                                  }
                                  uVar53 = uVar48 + 1;
                                }
                                bVar60 = uVar27 != 0;
                                uVar27 = uVar27 - 1;
                                uVar53 = uVar48 + 1;
                              } while (bVar60);
                              psVar58[bVar11] = sVar38;
                              uVar48 = uVar48 + 1;
LAB_0010d8bc:
                            } while ((int)uVar48 <= iVar54);
                          }
                          else {
                            psVar30->eob_run = iVar54 + -1;
                            uVar18 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                            for (; (long)uVar48 <= (long)psVar30->spec_end; uVar48 = uVar48 + 1) {
                              bVar12 = ""[uVar48];
                              if (((psVar58[bVar12] != 0) &&
                                  (iVar23 = stbi__jpeg_get_bit(psVar30), iVar23 != 0)) &&
                                 (sVar38 = psVar58[bVar12], (uVar18 & (int)sVar38) == 0)) {
                                uVar27 = -uVar18;
                                if (0 < sVar38) {
                                  uVar27 = uVar18;
                                }
                                psVar58[bVar12] = (short)uVar27 + sVar38;
                              }
                            }
                          }
                        }
                        iVar23 = psVar30->todo;
                        psVar30->todo = iVar23 + -1;
                        if (iVar23 < 2) {
                          if (psVar30->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar30);
                          }
                          bVar12 = psVar30->marker;
                          if ((bVar12 & 0xf8) != 0xd0) goto LAB_0010de90;
                          stbi__jpeg_reset(psVar30);
                        }
                      }
                    }
                  }
                  else {
                    for (iVar16 = 0; iVar16 < psVar30->img_mcu_y; iVar16 = iVar16 + 1) {
                      for (iVar22 = 0; iVar22 < psVar30->img_mcu_x; iVar22 = iVar22 + 1) {
                        for (lVar36 = 0; lVar36 < psVar30->scan_n; lVar36 = lVar36 + 1) {
                          iVar55 = psVar30->order[lVar36];
                          for (iVar39 = 0; iVar39 < paVar1[iVar55].v; iVar39 = iVar39 + 1) {
                            iVar42 = 0;
                            while (iVar42 < paVar1[iVar55].h) {
                              iVar23 = stbi__jpeg_decode_block_prog_dc
                                                 (psVar30,paVar1[iVar55].coeff +
                                                          (paVar1[iVar55].h * iVar22 + iVar42 +
                                                          (paVar1[iVar55].v * iVar16 + iVar39) *
                                                          paVar1[iVar55].coeff_w) * 0x40,
                                                  (stbi__huffman *)
                                                  psVar30->huff_dc[paVar1[iVar55].hd].fast,iVar55);
                              iVar42 = iVar42 + 1;
                              if (iVar23 == 0) goto LAB_0010ef88;
                            }
                          }
                        }
                        iVar55 = psVar30->todo;
                        psVar30->todo = iVar55 + -1;
                        if (iVar55 < 2) {
                          if (psVar30->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar30);
                          }
                          bVar12 = psVar30->marker;
                          if ((bVar12 & 0xf8) != 0xd0) goto LAB_0010de90;
                          stbi__jpeg_reset(psVar30);
                        }
                      }
                    }
                  }
                  bVar12 = psVar30->marker;
LAB_0010de90:
                  if (bVar12 == 0xff) {
                    do {
                      iVar16 = stbi__at_eof(psVar30->s);
                      if (iVar16 != 0) goto LAB_0010d442;
                      sVar9 = stbi__get8(psVar30->s);
                    } while (sVar9 != 0xff);
                    sVar9 = stbi__get8(psVar30->s);
                    psVar30->marker = sVar9;
                  }
                  goto LAB_0010d442;
                }
                pcVar28 = "bad SOS";
              }
LAB_0010ef7f:
              *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
            }
LAB_0010ef88:
            stbi__cleanup_jpeg(psVar30);
          }
          else {
            *(char **)(in_FS_OFFSET + -0x20) = "bad req_comp";
          }
LAB_0010ef95:
          local_8980 = (stbi__context *)0x0;
LAB_0010ca0c:
          free(psVar30);
          return local_8980;
        }
        goto LAB_0010dfe2;
      }
    }
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    if ((sVar9 != 'P') || ((byte)(sVar10 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 != 0) {
        local_8988 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        if (local_8988 == (float *)0x0) {
          return (void *)0x0;
        }
        iVar16 = *x;
        iVar22 = *y;
        uVar48 = 0;
        pvVar29 = stbi__malloc_mad3(iVar16,iVar22,req_comp,0);
        if (pvVar29 != (void *)0x0) {
          uVar18 = (req_comp + (req_comp & 1U)) - 1;
          uVar27 = iVar22 * iVar16;
          uVar53 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar53 = uVar48;
          }
          lVar36 = (long)req_comp;
          pvVar50 = pvVar29;
          pfVar46 = local_8988;
          uVar37 = (ulong)uVar27;
          if ((int)uVar27 < 1) {
            uVar37 = uVar48;
          }
          for (; uVar48 != uVar37; uVar48 = uVar48 + 1) {
            for (uVar40 = 0; uVar53 != uVar40; uVar40 = uVar40 + 1) {
              fVar61 = powf(pfVar46[uVar40] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar62 = fVar61 * 255.0 + 0.5;
              fVar61 = 0.0;
              if (0.0 <= fVar62) {
                fVar61 = fVar62;
              }
              fVar62 = 255.0;
              if (fVar61 <= 255.0) {
                fVar62 = fVar61;
              }
              *(char *)((long)pvVar50 + uVar40) = (char)(int)fVar62;
            }
            if ((int)uVar53 < req_comp) {
              lVar32 = uVar48 * lVar36 + uVar53;
              fVar62 = local_8988[lVar32] * 255.0 + 0.5;
              fVar61 = 0.0;
              if (0.0 <= fVar62) {
                fVar61 = fVar62;
              }
              fVar62 = 255.0;
              if (fVar61 <= 255.0) {
                fVar62 = fVar61;
              }
              *(char *)((long)pvVar29 + lVar32) = (char)(int)fVar62;
            }
            pvVar50 = (void *)((long)pvVar50 + lVar36);
            pfVar46 = pfVar46 + lVar36;
          }
          free(local_8988);
          return pvVar29;
        }
LAB_0010dfdd:
        free(local_8988);
        goto LAB_0010dfe2;
      }
      stbi__get8(s);
      bVar12 = stbi__get8(s);
      if (bVar12 < 2) {
        bVar11 = stbi__get8(s);
        if (bVar12 == 1) {
          if ((bVar11 & 0xf7) == 1) {
            iVar16 = 4;
            stbi__skip(s,4);
            bVar11 = stbi__get8(s);
            if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
            goto LAB_0010dffc;
          }
          goto LAB_0010def3;
        }
        if ((bVar11 & 0xf6) != 2) goto LAB_0010def3;
        iVar16 = 9;
LAB_0010dffc:
        stbi__skip(s,iVar16);
        iVar16 = stbi__get16le(s);
        if ((iVar16 == 0) || (iVar16 = stbi__get16le(s), iVar16 == 0)) goto LAB_0010def3;
        bVar11 = stbi__get8(s);
        if (bVar12 != 1) {
          if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            goto LAB_0010e8cf;
          }
          goto LAB_0010def3;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar11 - 8 & 0xf7) == 0) {
LAB_0010e8cf:
          bVar11 = stbi__get8(s);
          sVar9 = stbi__get8(s);
          bVar13 = stbi__get8(s);
          iVar16 = stbi__get16le(s);
          uVar25 = stbi__get16le(s);
          bVar12 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar18 = stbi__get16le(s);
          uVar27 = stbi__get16le(s);
          bVar14 = stbi__get8(s);
          pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
          bVar15 = stbi__get8(s);
          _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
          if (sVar9 == '\0') {
            uVar24 = bVar13 - 8;
            if (bVar13 < 8) {
              uVar24 = (uint)bVar13;
            }
            uVar24 = (uint)(uVar24 == 3);
            bVar12 = bVar14;
          }
          else {
            uVar24 = 0;
          }
          uVar24 = stbi__tga_get_comp((uint)bVar12,uVar24,(int *)pal);
          if (uVar24 == 0) {
            pcVar28 = "bad format";
            goto LAB_0010c61d;
          }
          *x = uVar18;
          *y = uVar27;
          if (comp != (int *)0x0) {
            *comp = uVar24;
          }
          iVar22 = stbi__mad3sizes_valid(uVar18,uVar27,uVar24,0);
          if (iVar22 == 0) goto LAB_0010ed7e;
          local_8988 = (float *)stbi__malloc_mad3(uVar18,uVar27,uVar24,0);
          if (local_8988 == (float *)0x0) goto LAB_0010dfe2;
          stbi__skip(s,(uint)bVar11);
          uVar48 = (ulong)uVar24;
          if (((sVar9 == '\0') && (bVar13 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
            uVar56 = 0;
            uVar25 = uVar27;
            while (uVar25 = uVar25 - 1, uVar25 != 0xffffffff) {
              uVar47 = uVar56;
              if ((bVar15 >> 5 & 1) == 0) {
                uVar47 = uVar25;
              }
              stbi__getn(s,(stbi_uc *)((long)local_8988 + (long)(int)(uVar47 * uVar24 * uVar18)),
                         uVar24 * uVar18);
              uVar56 = uVar56 + 1;
            }
          }
          else {
            if (sVar9 == '\0') {
              local_8970 = (float *)0x0;
            }
            else {
              if (uVar25 == 0) {
LAB_0010fc45:
                free(local_8988);
                pcVar28 = "bad palette";
                goto LAB_0010c61d;
              }
              stbi__skip(s,iVar16);
              local_8970 = (float *)stbi__malloc_mad2(uVar25,uVar24,0);
              if (local_8970 == (float *)0x0) goto LAB_0010dfdd;
              if (pal[0] == (stbi_uc  [4])0x0) {
                iVar16 = stbi__getn(s,(stbi_uc *)local_8970,uVar24 * uVar25);
                if (iVar16 == 0) {
                  free(local_8988);
                  local_8988 = local_8970;
                  goto LAB_0010fc45;
                }
              }
              else {
                if (uVar24 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                                ,0x16f1,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                for (lVar36 = 0; uVar25 * 3 != (int)lVar36; lVar36 = lVar36 + 3) {
                  stbi__tga_read_rgb16(s,(stbi_uc *)((long)local_8970 + lVar36));
                }
              }
            }
            bVar60 = true;
            iVar16 = 0;
            uVar56 = 0;
            pfVar46 = local_8988;
            for (uVar53 = 0; uVar53 != uVar27 * uVar18; uVar53 = uVar53 + 1) {
              if (bVar13 < 8) {
LAB_0010fa96:
                if (sVar9 == '\0') {
                  if (pal[0] == (stbi_uc  [4])0x0) {
                    for (uVar37 = 0; uVar48 != uVar37; uVar37 = uVar37 + 1) {
                      sVar10 = stbi__get8(s);
                      value[uVar37] = sVar10;
                    }
                  }
                  else {
                    if (uVar24 != 3) {
                      __assert_fail("tga_comp == STBI_rgb",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Yousazoe[P]RayTracing-Dev/vendor/stb/stb_image.h"
                                    ,0x1722,
                                    "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                   );
                    }
                    stbi__tga_read_rgb16(s,value);
                  }
                }
                else {
                  if (bVar14 == 8) {
                    bVar12 = stbi__get8(s);
                    uVar47 = (uint)bVar12;
                  }
                  else {
                    uVar47 = stbi__get16le(s);
                  }
                  if (uVar25 <= uVar47) {
                    uVar47 = 0;
                  }
                  for (uVar37 = 0; uVar48 != uVar37; uVar37 = uVar37 + 1) {
                    value[uVar37] = *(stbi_uc *)((long)local_8970 + uVar37 + uVar47 * uVar24);
                  }
                }
              }
              else {
                if (iVar16 == 0) {
                  bVar12 = stbi__get8(s);
                  iVar16 = (bVar12 & 0x7f) + 1;
                  uVar56 = (uint)(bVar12 >> 7);
                  goto LAB_0010fa96;
                }
                if (uVar56 == 0 || bVar60) {
                  uVar56 = (uint)(uVar56 != 0);
                  goto LAB_0010fa96;
                }
                uVar56 = 1;
              }
              for (uVar37 = 0; uVar48 != uVar37; uVar37 = uVar37 + 1) {
                *(stbi_uc *)((long)pfVar46 + uVar37) = value[uVar37];
              }
              iVar16 = iVar16 + -1;
              pfVar46 = (float *)((long)pfVar46 + uVar48);
              bVar60 = false;
            }
            if ((bVar15 >> 5 & 1) == 0) {
              iVar16 = uVar24 * uVar18;
              iVar22 = (uVar27 - 1) * iVar16;
              uVar25 = 0;
              for (uVar56 = 0; uVar56 != uVar27 + 1 >> 1; uVar56 = uVar56 + 1) {
                pfVar46 = local_8988;
                for (iVar55 = iVar16; 0 < iVar55; iVar55 = iVar55 + -1) {
                  uVar3 = *(undefined1 *)((long)pfVar46 + (ulong)uVar25);
                  *(undefined1 *)((long)pfVar46 + (ulong)uVar25) =
                       *(undefined1 *)((long)pfVar46 + (long)iVar22);
                  *(undefined1 *)((long)pfVar46 + (long)iVar22) = uVar3;
                  pfVar46 = (float *)((long)pfVar46 + 1);
                }
                uVar25 = uVar25 + iVar16;
                iVar22 = iVar22 - iVar16;
              }
            }
            free(local_8970);
          }
          if ((2 < uVar24) && (pal[0] == (stbi_uc  [4])0x0)) {
            iVar16 = uVar27 * uVar18;
            puVar43 = (undefined1 *)((long)local_8988 + 2);
            while (bVar60 = iVar16 != 0, iVar16 = iVar16 + -1, bVar60) {
              uVar3 = puVar43[-2];
              puVar43[-2] = *puVar43;
              *puVar43 = uVar3;
              puVar43 = puVar43 + uVar48;
            }
          }
          if (req_comp == 0) {
            return local_8988;
          }
          if (uVar24 == req_comp) {
            return local_8988;
          }
LAB_0010e9ee:
          puVar33 = stbi__convert_format((uchar *)local_8988,uVar24,req_comp,uVar18,uVar27);
          return puVar33;
        }
      }
      else {
LAB_0010def3:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      pcVar28 = "unknown image type";
      goto LAB_0010c61d;
    }
    y_00 = &s->img_y;
    comp_00 = &s->img_n;
    iVar16 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
    ri->bits_per_channel = iVar16;
    if (iVar16 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar17 = *y_00;
      *y = sVar17;
      iVar16 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar16;
        sVar17 = *y_00;
      }
      sVar19 = s->img_x;
      iVar55 = ri->bits_per_channel / 8;
      iVar39 = stbi__mad4sizes_valid(iVar16,sVar19,sVar17,iVar55,iVar22);
      if (iVar39 != 0) {
        puVar33 = (uchar *)stbi__malloc_mad4(iVar16,sVar19,sVar17,iVar55,iVar22);
        if (puVar33 != (uchar *)0x0) {
          stbi__getn(s,puVar33,sVar17 * iVar16 * sVar19 * iVar55);
          if (req_comp == 0) {
            return puVar33;
          }
          if (*comp_00 == req_comp) {
            return puVar33;
          }
          puVar33 = stbi__convert_format(puVar33,*comp_00,req_comp,s->img_x,s->img_y);
          return puVar33;
        }
        goto LAB_0010dfe2;
      }
    }
  }
LAB_0010ed7e:
  pcVar28 = "too large";
LAB_0010c61d:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
  return (void *)0x0;
LAB_0010e982:
  pcVar28 = "bad file";
LAB_0010e989:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
LAB_0010e99b:
  free(local_8988);
  local_8988 = (float *)0x0;
LAB_0010e9c4:
  *x = uVar18;
  *y = uVar27;
  bVar60 = req_comp != 0;
  if (bVar60) {
    uVar24 = req_comp;
  }
  req_comp = uVar24;
  if (!bVar60 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar24 = 4;
  goto LAB_0010e9ee;
LAB_0010ea07:
  pcVar28 = "bad huffman code";
  goto LAB_0010ef7f;
LAB_0010d442:
  bVar12 = stbi__get_marker(psVar30);
  goto LAB_0010d3df;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}